

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O1

QList<QSslCertificate> *
QTlsPrivate::X509CertificateOpenSSL::certificatesFromDer
          (QList<QSslCertificate> *__return_storage_ptr__,QByteArray *der,int count)

{
  X509 *x509;
  char *pcVar1;
  ulong c;
  long in_FS_OFFSET;
  uchar *data;
  undefined1 local_48 [8];
  uchar *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSslCertificate *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_40 = (uchar *)(der->d).ptr;
  if (local_40 == (uchar *)0x0) {
    local_40 = (uchar *)&QByteArray::_empty;
  }
  pcVar1 = (char *)(der->d).size;
  if (0 < (int)pcVar1) {
    do {
      if ((count != -1) && ((long)count <= (__return_storage_ptr__->d).size)) break;
      c = (ulong)((uint)pcVar1 & 0x7fffffff);
      x509 = q_d2i_X509((X509 **)0x0,&local_40,c);
      if (x509 == (X509 *)0x0) break;
      certificateFromX509((X509CertificateOpenSSL *)local_48,x509);
      QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate>
                ((QMovableArrayOps<QSslCertificate> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QSslCertificate *)local_48);
      QList<QSslCertificate>::end(__return_storage_ptr__);
      QSslCertificate::~QSslCertificate((QSslCertificate *)local_48);
      q_X509_free(x509);
      pcVar1 = (der->d).ptr;
      if (pcVar1 == (char *)0x0) {
        pcVar1 = (char *)&QByteArray::_empty;
      }
      pcVar1 = pcVar1 + (c - (long)local_40);
    } while (0 < (int)pcVar1);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificate> X509CertificateOpenSSL::certificatesFromDer(const QByteArray &der, int count)
{
    QList<QSslCertificate> certificates;

    const unsigned char *data = (const unsigned char *)der.data();
    int size = der.size();

    while (size > 0 && (count == -1 || certificates.size() < count)) {
        if (X509 *x509 = q_d2i_X509(nullptr, &data, size)) {
            certificates << certificateFromX509(x509);
            q_X509_free(x509);
        } else {
            break;
        }
        size -= ((const char *)data - der.data());
    }

    return certificates;
}